

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceProtocEditionsSupport
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer ppFVar1;
  FileDescriptor *this_00;
  bool bVar2;
  Edition EVar3;
  char *extraout_RDX;
  pointer ppFVar4;
  string_view filename;
  string_view format;
  Arg *in_stack_fffffffffffffed8;
  Edition edition;
  Edition local_11c;
  StringifySink local_118;
  StringifySink local_f8;
  string local_d8;
  Arg local_b8;
  size_type local_88;
  pointer local_80;
  Arg local_58;
  
  if (this->experimental_editions_ == false) {
    ppFVar1 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar4 = (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar1;
        ppFVar4 = ppFVar4 + 1) {
      this_00 = *ppFVar4;
      EVar3 = FileDescriptor::edition(this_00);
      filename._M_str = extraout_RDX;
      filename._M_len = (size_t)(this_00->name_->_M_dataplus)._M_p;
      edition = EVar3;
      bVar2 = CanSkipEditionCheck((compiler *)this_00->name_->_M_string_length,filename);
      if (1000 < (int)EVar3 && !bVar2) {
        local_80 = (this_00->name_->_M_dataplus)._M_p;
        local_88 = this_00->name_->_M_string_length;
        local_f8.buffer_._M_dataplus._M_p = (pointer)&local_f8.buffer_.field_2;
        local_f8.buffer_.field_2._M_allocated_capacity = 0;
        local_f8.buffer_.field_2._8_8_ = 0;
        local_f8.buffer_._M_string_length = 0;
        local_b8.piece_ =
             absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                       (&local_f8,&edition);
        local_11c = EDITION_2023;
        local_118.buffer_._M_dataplus._M_p = (pointer)&local_118.buffer_.field_2;
        local_118.buffer_.field_2._M_allocated_capacity = 0;
        local_118.buffer_.field_2._8_8_ = 0;
        local_118.buffer_._M_string_length = 0;
        local_58.piece_ =
             absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                       (&local_118,&local_11c);
        format._M_str = (char *)&local_88;
        format._M_len =
             (size_t)
             "$0: is a file using edition $1, which is later than the protoc maximum supported edition $2."
        ;
        absl::lts_20250127::Substitute_abi_cxx11_
                  (&local_d8,(lts_20250127 *)0x5c,format,&local_b8,&local_58,
                   in_stack_fffffffffffffed8);
        std::operator<<((ostream *)&std::cerr,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_f8);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceProtocEditionsSupport(
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if (edition > ProtocMaximumEdition()) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $1, which is later than the protoc "
          "maximum supported edition $2.",
          fd->name(), edition, ProtocMaximumEdition());
      return false;
    }
  }
  return true;
}